

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegressionTree.cpp
# Opt level: O0

void __thiscall RegressionTree::run(RegressionTree *this)

{
  long in_RDI;
  QueryCompiler *in_stack_000000a0;
  RegressionTree *in_stack_000001c0;
  RegressionTree *in_stack_000002f0;
  RegressionTree *in_stack_00000430;
  RegressionTree *in_stack_00000750;
  
  std::operator<<((ostream *)&std::cout,"Starting Regression Tree - Run() \n");
  loadFeatures(in_stack_00000750);
  std::operator<<((ostream *)&std::cout,"Loaded Feautres \n");
  computeCandidates(in_stack_00000430);
  std::operator<<((ostream *)&std::cout,"Computed Candidates \n");
  if ((*(byte *)(in_RDI + 0x50) & 1) == 0) {
    regressionTreeQueries(in_stack_000002f0);
  }
  else {
    classificationTreeQueries(in_stack_000001c0);
  }
  std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x204fdf);
  QueryCompiler::compile(in_stack_000000a0);
  return;
}

Assistant:

void RegressionTree::run()
{
    cout << "Starting Regression Tree - Run() \n";

    loadFeatures();

    cout << "Loaded Feautres \n";

    computeCandidates();

    cout << "Computed Candidates \n";

    // genDynamicFunctions();

    if (_classification)
        classificationTreeQueries();
    else
        regressionTreeQueries();
    
    _compiler->compile();
}